

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-canvas.c
# Opt level: O3

void plutovg_canvas_font_metrics
               (plutovg_canvas_t *canvas,float *ascent,float *descent,float *line_gap,
               plutovg_rect_t *extents)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  plutovg_font_face_t *ppVar6;
  float fVar7;
  
  ppVar6 = canvas->state->font_face;
  if ((ppVar6 != (plutovg_font_face_t *)0x0) && (fVar7 = canvas->state->font_size, 0.0 < fVar7)) {
    uVar3 = *(ushort *)((ppVar6->info).data + (long)(ppVar6->info).head + 0x12);
    fVar7 = fVar7 / (float)(ushort)(uVar3 << 8 | uVar3 >> 8);
    if (ascent != (float *)0x0) {
      *ascent = (float)ppVar6->ascent * fVar7;
    }
    if (descent != (float *)0x0) {
      *descent = (float)ppVar6->descent * fVar7;
    }
    if (line_gap != (float *)0x0) {
      *line_gap = (float)ppVar6->line_gap * fVar7;
    }
    if (extents != (plutovg_rect_t *)0x0) {
      uVar1 = ppVar6->y1;
      uVar2 = ppVar6->x2;
      iVar4 = ppVar6->x1;
      iVar5 = ppVar6->y2;
      extents->x = fVar7 * (float)iVar4;
      extents->y = -fVar7 * (float)iVar5;
      extents->w = fVar7 * (float)(uVar2 - iVar4);
      extents->h = -fVar7 * (float)(uVar1 - iVar5);
    }
    return;
  }
  if (ascent != (float *)0x0) {
    *ascent = 0.0;
  }
  if (descent != (float *)0x0) {
    *descent = 0.0;
  }
  if (line_gap != (float *)0x0) {
    *line_gap = 0.0;
  }
  if (extents != (plutovg_rect_t *)0x0) {
    extents->x = 0.0;
    extents->y = 0.0;
    extents->w = 0.0;
    extents->h = 0.0;
  }
  return;
}

Assistant:

void plutovg_canvas_font_metrics(const plutovg_canvas_t* canvas, float* ascent, float* descent, float* line_gap, plutovg_rect_t* extents)
{
    plutovg_state_t* state = canvas->state;
    if(state->font_face && state->font_size > 0.f) {
        plutovg_font_face_get_metrics(state->font_face, state->font_size, ascent, descent, line_gap, extents);
        return;
    }

    if(ascent) *ascent = 0.f;
    if(descent) *descent = 0.f;
    if(line_gap) *line_gap = 0.f;
    if(extents) {
        extents->x = 0.f;
        extents->y = 0.f;
        extents->w = 0.f;
        extents->h = 0.f;
    }
}